

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O0

Link * Link::factory(int type_,string *name_,MemPool *memPool)

{
  Pump *pPVar1;
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  MemPool *local_28;
  MemPool *memPool_local;
  string *name__local;
  Pump *pPStack_10;
  int type__local;
  
  local_28 = memPool;
  memPool_local = (MemPool *)name_;
  name__local._4_4_ = type_;
  if (type_ == 0) {
    pPVar1 = (Pump *)MemPool::alloc(memPool,0xe8);
    std::__cxx11::string::string(local_48,(string *)name_);
    Pipe::Pipe((Pipe *)pPVar1,(string *)local_48);
    pPStack_10 = pPVar1;
    std::__cxx11::string::~string(local_48);
  }
  else if (type_ == 1) {
    pPVar1 = (Pump *)MemPool::alloc(memPool,0x148);
    std::__cxx11::string::string(local_78,(string *)name_);
    Pump::Pump(pPVar1,(string *)local_78);
    pPStack_10 = pPVar1;
    std::__cxx11::string::~string(local_78);
  }
  else if (type_ == 2) {
    pPVar1 = (Pump *)MemPool::alloc(memPool,0xb8);
    std::__cxx11::string::string(local_98,(string *)name_);
    Valve::Valve((Valve *)pPVar1,(string *)local_98);
    pPStack_10 = pPVar1;
    std::__cxx11::string::~string(local_98);
  }
  else {
    pPStack_10 = (Pump *)0x0;
  }
  return &pPStack_10->super_Link;
}

Assistant:

Link* Link::factory(int type_, string name_, MemPool* memPool)
{
    switch (type_)
    {
    case PIPE:
        return new(memPool->alloc(sizeof(Pipe))) Pipe(name_);
        break;
    case PUMP:
        return new(memPool->alloc(sizeof(Pump))) Pump(name_);
        break;
    case VALVE:
        return new(memPool->alloc(sizeof(Valve))) Valve(name_);
        break;
    default:
        return nullptr;
    }
}